

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall TcpServerImpl::SelectThread(TcpServerImpl *this)

{
  int iVar1;
  uint __fd;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  long *plVar5;
  int *piVar6;
  uint *puVar7;
  int iVar8;
  int iVar9;
  atomic<unsigned_int> nNewConCbCount;
  socklen_t addLen;
  vector<int,_std::allocator<int>_> vSockets;
  int32_t fdClient;
  timeval timeout;
  fd_set readfd;
  sockaddr_storage addrCl;
  int local_184;
  long local_180;
  vector<int,_std::allocator<int>_> local_178;
  int local_15c;
  timeval local_158;
  TcpServerImpl *local_140;
  fd_set local_138;
  long *local_b0 [16];
  
  local_184 = 0;
  if ((this->super_BaseSocketImpl).m_bStop == false) {
    local_140 = this;
    do {
      local_138.fds_bits[0xe] = 0;
      local_138.fds_bits[0xf] = 0;
      local_138.fds_bits[0xc] = 0;
      local_138.fds_bits[0xd] = 0;
      local_138.fds_bits[10] = 0;
      local_138.fds_bits[0xb] = 0;
      local_138.fds_bits[8] = 0;
      local_138.fds_bits[9] = 0;
      local_138.fds_bits[6] = 0;
      local_138.fds_bits[7] = 0;
      local_138.fds_bits[4] = 0;
      local_138.fds_bits[5] = 0;
      local_138.fds_bits[2] = 0;
      local_138.fds_bits[3] = 0;
      local_138.fds_bits[0] = 0;
      local_138.fds_bits[1] = 0;
      local_158.tv_sec = 2;
      local_158.tv_usec = 0;
      piVar6 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar6 == piVar2) {
        iVar8 = 1;
      }
      else {
        iVar8 = 0;
        do {
          iVar1 = *piVar6;
          iVar9 = iVar1 + 0x3f;
          if (-1 < iVar1) {
            iVar9 = iVar1;
          }
          local_138.fds_bits[iVar9 >> 6] =
               local_138.fds_bits[iVar9 >> 6] | 1L << ((byte)iVar1 & 0x3f);
          if (iVar8 < iVar1) {
            iVar8 = iVar1;
          }
          piVar6 = piVar6 + 1;
        } while (piVar6 != piVar2);
        iVar8 = iVar8 + 1;
      }
      iVar8 = select(iVar8,&local_138,(fd_set *)0x0,(fd_set *)0x0,&local_158);
      if (0 < iVar8) {
        local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        puVar3 = (uint *)(this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        for (puVar7 = (uint *)(this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start; this = local_140, puVar7 != puVar3;
            puVar7 = puVar7 + 1) {
          __fd = *puVar7;
          uVar4 = __fd + 0x3f;
          if (-1 < (int)__fd) {
            uVar4 = __fd;
          }
          if (((ulong)local_138.fds_bits[(int)uVar4 >> 6] >> ((ulong)__fd & 0x3f) & 1) != 0) {
            iVar8 = 0x10;
            do {
              local_180 = CONCAT44(local_180._4_4_,0x80);
              local_15c = accept(__fd,(sockaddr *)local_b0,(socklen_t *)&local_180);
              if (local_15c == -1) break;
              if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_178,
                           (iterator)
                           local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_15c);
              }
              else {
                *local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_15c;
                local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
        }
        if ((local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish !=
             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start) && ((local_140->super_BaseSocketImpl).m_bStop == false)) {
          LOCK();
          local_184 = local_184 + 1;
          UNLOCK();
          local_180 = 0;
          plVar5 = (long *)operator_new(0x30);
          *plVar5 = (long)&PTR___State_impl_001477e8;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)(plVar5 + 1),&local_178);
          plVar5[4] = (long)this;
          plVar5[5] = (long)&local_184;
          local_b0[0] = plVar5;
          std::thread::_M_start_thread(&local_180,(sockaddr *)local_b0,0);
          if (local_b0[0] != (long *)0x0) {
            (**(code **)(*local_b0[0] + 8))();
          }
          std::thread::detach();
          if (local_180 != 0) {
            std::terminate();
          }
        }
        if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
    } while ((this->super_BaseSocketImpl).m_bStop == false);
  }
  if (local_184 != 0) {
    do {
      local_138.fds_bits[0] = 0;
      local_138.fds_bits[1] = 1000000;
      do {
        iVar8 = nanosleep((timespec *)&local_138,(timespec *)&local_138);
        if (iVar8 != -1) break;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
    } while (local_184 != 0);
  }
  Delete(this);
  return;
}

Assistant:

void TcpServerImpl::SelectThread()
{
    atomic<uint32_t> nNewConCbCount(0);

    while (m_bStop == false)
    {
        fd_set readfd{};
        struct timeval timeout{};
        SOCKET maxFd = 0;

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);

        for (auto Sock : m_vSock)
        {
            FD_SET(Sock, &readfd);
            if (Sock > maxFd)
                maxFd = Sock;
        }

        const int iRes = ::select(static_cast<int>(maxFd + 1), &readfd, nullptr, nullptr, &timeout);
        if (iRes > 0)
        {
            vector<SOCKET> vSockets;

            for (auto Sock : m_vSock)
            {
                if (FD_ISSET(Sock, &readfd))
                {
                    for (int n = 0; n < 16; ++n)                // The ACCEPT_QUEUE is an optimization mechanism that allows the server to
                    {                                           // accept() up to this many connections before serving any of them.  The
                        struct sockaddr_storage addrCl;         // reason is that the timeout waiting for the accept() is much shorter
                        socklen_t addLen = sizeof(addrCl);      // than the timeout for the actual processing.

                        const SOCKET fdClient = ::accept(Sock, reinterpret_cast<struct sockaddr*>(&addrCl), &addLen);
                        if (fdClient == INVALID_SOCKET)
                            break;

                        vSockets.push_back(fdClient);
                    }
                }
            }

            if (vSockets.size() > 0 && m_bStop == false)
            {
                nNewConCbCount++;

                thread([this, &nNewConCbCount](const vector<SOCKET> vNewSockets)
                {
                    vector<TcpSocket*> vNewConnections;
                    for (const SOCKET sock : vNewSockets)
                    {
                        TcpSocket* pClient = MakeClientConnection(sock);
                        if (pClient == nullptr)
                            continue;
                        if (pClient->GetErrorNo() != 0)
                        {
                            if (m_fErrorParam)
                                m_fErrorParam(pClient, m_pvUserData);  // Must call Close() in the error callback
                            else if (m_fError)
                                m_fError(pClient);  // Must call Close() in the error callback
                            else
                                pClient->Close();
                            continue;
                        }
                        vNewConnections.push_back(pClient);
                    }
                    if (m_fNewConnectionParam != nullptr && m_bStop != true)
                        m_fNewConnectionParam(vNewConnections, m_pvUserData);
                    else if (m_fNewConnection != nullptr && m_bStop != true)
                        m_fNewConnection(vNewConnections);
                    else
                    {
                        for (auto pClient : vNewConnections)
                            pClient->Close();
                    }
                    nNewConCbCount--;
                }, vSockets).detach();
            }
        }
    }

    while (nNewConCbCount != 0)
        this_thread::sleep_for(chrono::milliseconds(1));

    Delete();
}